

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

bool __thiscall FIX::Session::shouldSendReset(Session *this)

{
  bool bVar1;
  StringField *this_00;
  string *psVar2;
  SEQNUM SVar3;
  bool local_51;
  undefined1 local_30 [8];
  string beginString;
  Session *this_local;
  
  beginString.field_2._8_8_ = this;
  this_00 = &SessionID::getBeginString(&this->m_sessionID)->super_StringField;
  psVar2 = StringField::operator_cast_to_string_(this_00);
  std::__cxx11::string::string((string *)local_30,(string *)psVar2);
  bVar1 = std::operator>=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"FIX.4.1");
  local_51 = false;
  if ((bVar1) &&
     ((((this->m_resetOnLogon & 1U) != 0 || ((this->m_resetOnLogout & 1U) != 0)) ||
      (local_51 = false, (this->m_resetOnDisconnect & 1U) != 0)))) {
    SVar3 = getExpectedSenderNum(this);
    local_51 = false;
    if (SVar3 == 1) {
      SVar3 = getExpectedTargetNum(this);
      local_51 = SVar3 == 1;
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return local_51;
}

Assistant:

bool Session::shouldSendReset() {
  std::string beginString = m_sessionID.getBeginString();
  return beginString >= FIX::BeginString_FIX41 && (m_resetOnLogon || m_resetOnLogout || m_resetOnDisconnect)
         && (getExpectedSenderNum() == 1) && (getExpectedTargetNum() == 1);
}